

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O3

void seq_print(uint32_t *script,uint32_t len,rnndeccontext *ctx,rnndomain *mmiodom)

{
  seq_op *psVar1;
  uint uVar2;
  rnndecaddrinfo *prVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar3;
  
  uVar5 = 0;
  while (uVar5 < len) {
    uVar2 = script[uVar5];
    if (0x3c < (uVar2 & 0xffff)) {
      return;
    }
    if (uVar2 + 0xfc000000 < 0xfc010000) {
      return;
    }
    uVar5 = (uVar2 >> 0x10) + uVar5;
    if (len < uVar5) {
      return;
    }
  }
  printf("SEQ script, size: %uB\n",(ulong)(len * 4));
  if (len == 0) {
    return;
  }
  uVar8 = 0;
  do {
    uVar12 = (uint)uVar8;
    uVar5 = script[uVar8];
    uVar2 = uVar5 & 0xffff;
    uVar3 = (ulong)uVar2;
    if (0x3c < uVar2) {
      pcVar6 = "%06x: Invalid op\n";
LAB_0024f112:
      printf(pcVar6,(ulong)(uVar12 << 2));
      return;
    }
    uVar13 = uVar5 >> 0x10;
    pcVar6 = (char *)(uVar3 * 3);
    if (uVar13 < seq_ops[uVar3].min_size) {
      pcVar6 = "%06x: Opcode size too small\n";
      goto LAB_0024f112;
    }
    psVar1 = seq_ops + uVar3;
    if (0x3c < uVar2) {
switchD_0024eb2b_caseD_10:
      printf("%06x: %-14s\n",(ulong)(uVar12 * 4),psVar1->txt,pcVar6);
      goto LAB_0024f027;
    }
    pcVar6 = "";
    switch(uVar2) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
      pcVar6 = "reg_last";
      if ((uVar5 & 1) == 0) {
        pcVar6 = "val_last";
      }
      printf("%06x: %-14s%s      %s 0x%08x\n",(ulong)(uVar12 * 4),psVar1->txt,pcVar6,
             seq_ops[uVar2 >> 1].binop,(ulong)script[uVar8 + 1]);
      break;
    case 10:
    case 0xc:
      uVar3 = 0;
      pcVar6 = "reg_last+";
      if (uVar2 - 0xb < 2) goto switchD_0024eb2b_caseD_b;
      goto LAB_0024ecdd;
    case 0xb:
switchD_0024eb2b_caseD_b:
      uVar3 = (ulong)script[uVar8 + 1];
LAB_0024ecdd:
      printf("%06x: %-14sval_last   :=  R[%s0x%06x]\n",(ulong)(uVar12 * 4),psVar1->txt,pcVar6,uVar3)
      ;
      break;
    case 0xd:
    case 0xe:
    case 0xf:
      pcVar6 = "";
      if ((uVar5 & 0xfffd) == 0xd) {
        pcVar6 = "reg_last+";
      }
      uVar3 = 0;
      if ((uVar5 & 0xfffe) == 0xe) {
        uVar3 = (ulong)script[uVar8 + 1];
      }
      uVar9 = (ulong)(uVar12 * 4);
      pcVar11 = psVar1->txt;
      pcVar10 = "%06x: %-14sR[%s0x%06x]   :=  val_last\n";
      goto LAB_0024ed28;
    default:
      goto switchD_0024eb2b_caseD_10;
    case 0x13:
    case 0x2e:
      uVar3 = (ulong)(uVar12 * 4);
      pcVar6 = psVar1->txt;
      uVar8 = (ulong)script[uVar8 + 1];
      pcVar11 = "%06x: %-14s%u ns\n";
      goto LAB_0024efc7;
    case 0x14:
      uVar5 = script[uVar8 + 1];
      uVar2 = uVar5 & 0xffff;
      if (uVar2 < 0x101) {
        if (uVar2 == 0) {
          pcVar6 = "HEAD0_VBLANK";
        }
        else if (uVar2 == 1) {
          pcVar6 = "HEAD1_VBLANK";
        }
        else if (uVar2 == 0x100) {
          pcVar6 = "HEAD0_HBLANK";
        }
        else {
LAB_0024f082:
          printf("%06x: Invalid param %08x for op 0x14\n",(ulong)(uVar12 * 4),(ulong)uVar5,"");
          uVar5 = script[uVar8 + 1];
          pcVar6 = "(unknown)   ";
        }
      }
      else if (uVar2 == 0x101) {
        pcVar6 = "HEAD1_HBLANK";
      }
      else if (uVar2 == 0x300) {
        pcVar6 = "FB_PAUSED   ";
      }
      else {
        if (uVar2 != 0x400) goto LAB_0024f082;
        pcVar6 = "PGRAPH_IDLE ";
      }
      uVar9 = (ulong)(uVar12 * 4);
      pcVar11 = psVar1->txt;
      uVar3 = (ulong)script[uVar12 + 2];
      if ((uVar5 >> 0x10 & 1) == 0) {
        pcVar10 = "%06x: %-14s%s  , %u ns\n";
      }
      else {
        pcVar10 = "%06x: %-14s!%s , %u ns\n";
      }
      goto LAB_0024ed28;
    case 0x15:
      uVar3 = (ulong)(uVar12 * 4);
      pcVar6 = psVar1->txt;
      uVar8 = (ulong)script[uVar8 + 1];
      uVar9 = (ulong)script[uVar12 + 2];
      pcVar11 = "%06x: %-14sR[last_reg] & 0x%08x == val_last, %u ns\n";
      goto LAB_0024f01d;
    case 0x17:
      uVar3 = (ulong)(uVar12 * 4);
      pcVar6 = psVar1->txt;
      uVar8 = (ulong)script[uVar8 + 1];
      pcVar11 = "%06x: %-14sval_last, %08x\n";
      goto LAB_0024efc7;
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
      uVar3 = (ulong)(uVar12 * 4);
      pcVar6 = psVar1->txt;
      uVar8 = (ulong)(script[uVar8 + 1] << 2);
      pcVar11 = "%06x: %-14s0x%06x\n";
      goto LAB_0024efc7;
    case 0x1f:
    case 0x2c:
      uVar9 = (ulong)(uVar12 * 4);
      pcVar11 = psVar1->txt;
      pcVar6 = seq_ops[uVar3].binop;
      uVar3 = (ulong)script[uVar8 + 1];
      pcVar10 = "%06x: %-14sval_last      %s R[0x%06x]\n";
      goto LAB_0024ed28;
    case 0x20:
      if (script[uVar8 + 1] == 1) {
        pcVar6 = "%06x: FB PAUSE\n";
      }
      else {
        pcVar6 = "%06x: FB RESUME\n";
      }
      printf(pcVar6,(ulong)(uVar12 * 4),
             (long)&switchD_0024eb2b::switchdataD_002555a4 +
             (long)(int)(&switchD_0024eb2b::switchdataD_002555a4)[uVar2],"");
      break;
    case 0x21:
      printf("%06x: SET REGISTERS:\n",(ulong)(uVar12 * 4),
             (long)&switchD_0024eb2b::switchdataD_002555a4 +
             (long)(int)(&switchD_0024eb2b::switchdataD_002555a4)[uVar2],"");
      uVar8 = 1;
      if (0x1ffff < uVar5) {
        uVar2 = uVar12 * 4 + 4;
        uVar8 = 1;
        uVar5 = uVar12;
        do {
          prVar4 = rnndec_decodeaddr(ctx,mmiodom,(ulong)script[uVar5 + 1],1);
          printf("%06x:               R[0x%06x]   :=  0x%08x     # %s\n",(ulong)uVar2,
                 (ulong)script[uVar5 + 1],(ulong)script[uVar5 + 2],prVar4->name);
          uVar8 = uVar8 + 2;
          uVar2 = uVar2 + 8;
          uVar5 = uVar5 + 2;
        } while (uVar8 < uVar13);
      }
      iVar7 = (int)uVar8;
      uVar5 = (iVar7 + uVar12) * 4 - 8;
      printf("%06x:               reg_last      :=  0x%08x\n",(ulong)uVar5,
             (ulong)script[(iVar7 + uVar12) - 2]);
      printf("%06x:               val_last      :=  0x%08x\n",(ulong)uVar5,
             (ulong)script[(iVar7 + uVar12) - 1]);
      break;
    case 0x22:
    case 0x30:
    case 0x32:
      uVar5 = script[uVar8 + 1];
      pcVar6 = psVar1->txt;
      pcVar11 = seq_ops[uVar3].binop;
      pcVar10 = "%06x: %-14sOUT[0x%x]      %s val_last\n";
      goto LAB_0024ec49;
    case 0x23:
    case 0x31:
    case 0x33:
      uVar5 = script[uVar8 + 1];
      pcVar6 = psVar1->txt;
      pcVar11 = seq_ops[uVar3].binop;
      pcVar10 = "%06x: %-14sOUT[OUT[0x%x]] %s val_last\n";
LAB_0024ec49:
      printf(pcVar10,(ulong)(uVar12 * 4),pcVar6,(ulong)uVar5,pcVar11);
      break;
    case 0x24:
      uVar3 = (ulong)(uVar12 * 4);
      pcVar6 = psVar1->txt;
      uVar8 = (ulong)script[uVar8 + 1];
      uVar9 = (ulong)script[uVar12 + 2];
      pcVar11 = "%06x: %-14sOUT[0x%x]      :=  %08x\n";
      goto LAB_0024f01d;
    case 0x25:
      uVar3 = (ulong)(uVar12 * 4);
      pcVar6 = psVar1->txt;
      uVar8 = (ulong)script[uVar8 + 1];
      uVar9 = (ulong)script[uVar12 + 2];
      pcVar11 = "%06x: %-14sOUT[OUT[0x%x]] :=  %08x\n";
      goto LAB_0024f01d;
    case 0x26:
    case 0x3b:
      uVar9 = (ulong)(uVar12 * 4);
      pcVar11 = psVar1->txt;
      pcVar6 = seq_ops[uVar3].binop;
      uVar3 = (ulong)script[uVar8 + 1];
      pcVar10 = "%06x: %-14sval_last      %s OUT[0x%x]\n";
      goto LAB_0024ed28;
    case 0x27:
    case 0x3c:
      uVar9 = (ulong)(uVar12 * 4);
      pcVar11 = psVar1->txt;
      pcVar6 = seq_ops[uVar3].binop;
      uVar3 = (ulong)script[uVar8 + 1];
      pcVar10 = "%06x: %-14sval_last      %s OUT[OUT[0x%x]]\n";
LAB_0024ed28:
      printf(pcVar10,uVar9,pcVar11,pcVar6,uVar3);
      break;
    case 0x28:
      uVar3 = (ulong)(uVar12 * 4);
      pcVar6 = psVar1->txt;
      uVar8 = (ulong)script[uVar8 + 1];
      pcVar11 = "%06x: %-14sreg_last      :=  OUT[0x%x]\n";
      goto LAB_0024efc7;
    case 0x29:
      uVar3 = (ulong)(uVar12 * 4);
      pcVar6 = psVar1->txt;
      uVar8 = (ulong)script[uVar8 + 1];
      pcVar11 = "%06x: %-14sreg_last      :=  OUT[OUT[0x%x]]\n";
      goto LAB_0024efc7;
    case 0x2a:
      printf("%06x: %-14sOUT[0x%x]      +=  0x%08x (%d)\n",(ulong)(uVar12 * 4),psVar1->txt,
             (ulong)script[uVar8 + 1],(ulong)script[uVar12 + 2],(ulong)script[uVar12 + 2]);
      break;
    case 0x2b:
      uVar3 = (ulong)(uVar12 * 4);
      pcVar6 = psVar1->txt;
      uVar8 = (ulong)script[uVar8 + 1];
      uVar9 = (ulong)script[uVar12 + 2];
      pcVar11 = "%06x: %-14sOUT[0x%x], 0x%08x\n";
      goto LAB_0024f01d;
    case 0x2d:
      uVar3 = (ulong)(uVar12 * 4);
      pcVar6 = psVar1->txt;
      uVar8 = (ulong)script[uVar8 + 1];
      uVar9 = (ulong)script[uVar12 + 2];
      pcVar11 = "%06x: %-14sHEAD%d HEAD%d\n";
LAB_0024f01d:
      printf(pcVar11,uVar3,pcVar6,uVar8,uVar9);
      break;
    case 0x34:
      uVar3 = (ulong)(uVar12 * 4);
      pcVar6 = psVar1->txt;
      uVar8 = (ulong)script[uVar8 + 1];
      pcVar11 = "%06x: %-14sOUT[0x%x]\n";
      goto LAB_0024efc7;
    case 0x35:
      uVar3 = (ulong)(uVar12 * 4);
      pcVar6 = psVar1->txt;
      uVar8 = (ulong)script[uVar8 + 1];
      pcVar11 = "%06x: %-14sOUT[OUT[0x%x]]\n";
LAB_0024efc7:
      printf(pcVar11,uVar3,pcVar6,uVar8);
    }
LAB_0024f027:
    uVar8 = (ulong)(uVar13 + uVar12);
    if (len <= uVar13 + uVar12) {
      return;
    }
  } while( true );
}

Assistant:

void
seq_print(uint32_t *script, uint32_t len, struct rnndeccontext *ctx, struct rnndomain *mmiodom)
{
	unsigned int pc, op, size;
	char *reg0;
	unsigned int reg1, i;
	const char *wait_op;

	/* Validate script, bail if invalid */
	for(pc = 0; pc < len; pc += size) {
		op = script[pc] & 0xffff;
		size = (script[pc] & 0xffff0000) >> 16;

		if(op > 0x3c || size > 0x3ff || size == 0)
			return;

		if(pc + size > len)
			return;
	}

	printf("SEQ script, size: %uB\n", len << 2);

	for(pc = 0; pc < len; pc += size) {
		op = script[pc] & 0xffff;
		size = (script[pc] & 0xffff0000) >> 16;

		if(op > 0x3c) {
			seq_out(pc,"Invalid op\n");
			return;
		}

		if(seq_ops[op].min_size > size){
			seq_out(pc,"Opcode size too small\n");
			return;
		}

		switch(op) {
		case 0x0:
		case 0x1:
		case 0x2:
		case 0x3:
		case 0x4:
		case 0x5:
		case 0x6:
		case 0x7:
		case 0x8:
		case 0x9:
			seq_outlast(pc,op,script[pc+1]);
			break;
		case 0xa:
		case 0xb:
		case 0xc:
			reg0 = "";
			reg1 = 0;

			if(op == 0xa || op == 0x0c) {
			        reg0 = "reg_last+";
			}

			if (op == 0xb || op == 0xc) {
				reg1 = script[pc+1];
			}
			seq_out_op(pc,op,"val_last   :=  R[%s0x%06x]\n",reg0,reg1);
			break;
		case 0xd:
		case 0xe:
		case 0xf:
			reg0 = "";
			reg1 = 0;

			if(op == 0xd || op == 0xf) {
			        reg0 = "reg_last+";
			}

			if (op == 0xe || op == 0xf) {
				reg1 = script[pc+1];
			}
			seq_out_op(pc,op,"R[%s0x%06x]   :=  val_last\n",reg0,reg1);
			break;
		case 0x13:
		case 0x2e:
			seq_out_op(pc,op,"%u ns\n",script[pc+1]);
			break;
		case 0x14:
			//seq_out_op(pc,op,"%s, %u ns\n",seq_wait_status[script[pc+1] & 0xff],script[pc+2]);
			switch(script[pc+1] & 0xffff) {
			case 0x0:
				wait_op = "HEAD0_VBLANK";
				break;
			case 0x1:
				wait_op = "HEAD1_VBLANK";
				break;
			case 0x100:
				wait_op = "HEAD0_HBLANK";
				break;
			case 0x101:
				wait_op = "HEAD1_HBLANK";
				break;
			case 0x300:
				wait_op = "FB_PAUSED   ";
				break;
			case 0x400:
				wait_op = "PGRAPH_IDLE ";
				break;
			default:
				wait_op = "(unknown)   ";
				seq_out(pc,"Invalid param %08x for op 0x14\n", script[pc+1]);
			}

			if(script[pc+1] & 0x10000) {
				seq_out_op(pc,op,"!%s , %u ns\n",wait_op,script[pc+2]);
			} else {
				seq_out_op(pc,op,"%s  , %u ns\n",wait_op,script[pc+2]);
			}
			break;
		case 0x15:
			seq_out_op(pc,op,"R[last_reg] & 0x%08x == val_last, %u ns\n",script[pc+1],script[pc+2]);
			break;
		case 0x16:
			seq_out_op(pc,op,"\n");
			break;
		case 0x17:
			seq_out_op(pc,op,"val_last, %08x\n", script[pc+1]);
			break;
		case 0x18:
		case 0x19:
		case 0x1a:
		case 0x1b:
		case 0x1c:
			seq_out_op(pc,op,"0x%06x\n", script[pc+1] << 2);
			break;
		case 0x1d:
		case 0x1e:
			seq_out_op(pc,op,"\n");
			break;
		case 0x1f:
		case 0x2c:
			seq_out_op(pc,op,"val_last      %s R[0x%06x]\n", seq_ops[op].binop, script[pc+1]);
			break;
		case 0x20:
			if(script[pc+1] == 1)
				seq_out(pc,"FB PAUSE\n");
			else
				seq_out(pc,"FB RESUME\n");
			break;
		case 0x21:
			seq_out(pc,"SET REGISTERS:\n");
			for (i = 1; i < size; i += 2) {
				struct rnndecaddrinfo *ai = rnndec_decodeaddr(ctx, mmiodom, script[pc+i], 1);
				seq_out(pc+i,"              R[0x%06x]   :=  0x%08x     # %s\n", script[pc+i], script[pc+i+1], ai->name);
			}
			seq_out(pc+i-2,"              reg_last      :=  0x%08x\n", script[pc+i-2]);
			seq_out(pc+i-2,"              val_last      :=  0x%08x\n", script[pc+i-1]);
			break;
		case 0x22:
		case 0x30:
		case 0x32:
			seq_out_op(pc,op,"OUT[0x%x]      %s val_last\n", script[pc+1], seq_ops[op].binop);
			break;
		case 0x23:
		case 0x31:
		case 0x33:
			seq_out_op(pc,op,"OUT[OUT[0x%x]] %s val_last\n", script[pc+1], seq_ops[op].binop);
			break;
		case 0x24:
			seq_out_op(pc,op,"OUT[0x%x]      :=  %08x\n", script[pc+1], script[pc+2]);
			break;
		case 0x25:
			seq_out_op(pc,op,"OUT[OUT[0x%x]] :=  %08x\n", script[pc+1], script[pc+2]);
			break;
		case 0x26:
		case 0x3b:
			seq_out_op(pc,op,"val_last      %s OUT[0x%x]\n", seq_ops[op].binop, script[pc+1]);
			break;
		case 0x27:
		case 0x3c:
			seq_out_op(pc,op,"val_last      %s OUT[OUT[0x%x]]\n", seq_ops[op].binop, script[pc+1]);
			break;
		case 0x28:
			seq_out_op(pc,op,"reg_last      :=  OUT[0x%x]\n", script[pc+1]);
			break;
		case 0x29:
			seq_out_op(pc,op,"reg_last      :=  OUT[OUT[0x%x]]\n", script[pc+1]);
			break;
		case 0x2a:
			seq_out_op(pc,op,"OUT[0x%x]      +=  0x%08x (%d)\n", script[pc+1], script[pc+2], script[pc+2]);
			break;
		case 0x2b:
			seq_out_op(pc,op,"OUT[0x%x], 0x%08x\n", script[pc+1], script[pc+2]);
			break;
		case 0x2d:
			seq_out_op(pc,op,"HEAD%d HEAD%d\n", script[pc+1], script[pc+2]);
			break;
		case 0x34:
			seq_out_op(pc,op,"OUT[0x%x]\n", script[pc+1]);
			break;
		case 0x35:
			seq_out_op(pc,op,"OUT[OUT[0x%x]]\n", script[pc+1]);
			break;
		default:
			seq_out_op(pc,op,"\n");
			break;
		}
	}
}